

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILBDOperator.cpp
# Opt level: O2

LBDOperator * lts2::CreateLbdOperatorFromYml(string *filename)

{
  char cVar1;
  LBDOperator *pLVar2;
  ostream *poVar3;
  int pheight;
  int pwidth;
  int M;
  int lbdType;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60 [16];
  FileStorage fs;
  
  local_70 = local_60;
  local_68 = 0;
  local_60[0] = 0;
  cv::FileStorage::FileStorage(&fs,(string *)filename,0,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  cVar1 = cv::FileStorage::isOpened();
  if (cVar1 == '\0') {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Invalid file: ");
    poVar3 = std::operator<<(poVar3,(string *)filename);
    std::endl<char,std::char_traits<char>>(poVar3);
    pLVar2 = (LBDOperator *)0x0;
  }
  else {
    lbdType = 0;
    M = 0x200;
    pheight = 0x20;
    pwidth = pheight;
    cv::FileStorage::operator[]((char *)&local_70);
    cv::operator>>((FileNode *)&local_70,&lbdType);
    cv::FileStorage::operator[]((char *)&local_70);
    cv::operator>>((FileNode *)&local_70,&M);
    cv::FileStorage::operator[]((char *)&local_70);
    cv::operator>>((FileNode *)&local_70,&pwidth);
    cv::FileStorage::operator[]((char *)&local_70);
    cv::operator>>((FileNode *)&local_70,&pheight);
    pLVar2 = CreateLbdOperator(lbdType,M);
    if (pLVar2 != (LBDOperator *)0x0) {
      (*(pLVar2->super_LinearOperator)._vptr_LinearOperator[5])(pLVar2);
    }
  }
  cv::FileStorage::~FileStorage(&fs);
  return pLVar2;
}

Assistant:

lts2::LBDOperator *lts2::CreateLbdOperatorFromYml(std::string const &filename)
{
  cv::FileStorage fs(filename, cv::FileStorage::READ);

  if (!fs.isOpened())
  {
    std::cerr << "Invalid file: " << filename << std::endl;
    return NULL;
  }

  LBDOperator *out = NULL;

  int lbdType = 0;
  int M = 512;
  int pwidth = 32;
  int pheight = 32;

  fs["lbd"] >> lbdType;
  fs["measures"] >> M;
  fs["width"] >> pwidth;
  fs["height"] >> pheight;

  out = lts2::CreateLbdOperator(lbdType, M);
  if (out)
  {
    cv::Size patchSize(pwidth, pheight);
    out->initWithPatchSize(patchSize);
  }

  return out;
}